

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apdu.c
# Opt level: O0

size_t apduCmdDec(apdu_cmd_t *cmd,octet *apdu,size_t count)

{
  ulong in_RDX;
  undefined1 *in_RSI;
  undefined1 *in_RDI;
  size_t rdf_len;
  size_t cdf_len;
  size_t cdf_len_len;
  undefined7 in_stack_ffffffffffffffb8;
  octet in_stack_ffffffffffffffbf;
  void *in_stack_ffffffffffffffc0;
  ulong local_38;
  ulong local_30;
  ulong local_28;
  ulong local_20;
  byte *local_18;
  size_t local_8;
  
  if (in_RDX < 4) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    if (in_RDI != (undefined1 *)0x0) {
      memSet(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbf,0x121832);
      *in_RDI = *in_RSI;
      in_RDI[1] = in_RSI[1];
      in_RDI[2] = in_RSI[2];
      in_RDI[3] = in_RSI[3];
    }
    local_18 = in_RSI + 4;
    local_20 = in_RDX - 4;
    if (((local_20 == 0) || (local_20 == 1)) || ((local_20 == 3 && (*local_18 == 0)))) {
      local_28 = 0;
      local_30 = 0;
    }
    else {
      if (*local_18 == 0) {
        if (local_20 < 3) {
          return 0xffffffffffffffff;
        }
        local_28 = 3;
        local_30 = (ulong)(byte)in_RSI[6] + (ulong)(byte)in_RSI[5] * 0x100;
      }
      else {
        local_28 = 1;
        local_30 = (ulong)*local_18;
      }
      local_18 = local_18 + local_28;
      local_20 = local_20 - local_28;
    }
    if (local_20 < local_30) {
      local_8 = 0xffffffffffffffff;
    }
    else {
      if (in_RDI != (undefined1 *)0x0) {
        memCopy(in_stack_ffffffffffffffc0,
                (void *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),0x121993);
      }
      local_18 = local_18 + local_30;
      switch(local_20 - local_30) {
      case 0:
        local_38 = 0;
        break;
      case 1:
        local_38 = (ulong)*local_18;
        if (local_38 == 0) {
          local_38 = 0x100;
        }
        if (local_28 == 3) {
          return 0xffffffffffffffff;
        }
        break;
      case 2:
        local_38 = (ulong)local_18[1] + (ulong)*local_18 * 0x100;
        if (local_38 == 0) {
          local_38 = 0x10000;
        }
        if ((local_28 < 2) || ((local_30 < 0x100 && (local_38 < 0x101)))) {
          return 0xffffffffffffffff;
        }
        break;
      case 3:
        local_38 = (ulong)local_18[2] + (ulong)local_18[1] * 0x100;
        if (local_38 == 0) {
          local_38 = 0x10000;
        }
        if (((*local_18 != 0) || (local_28 != 0)) || (local_38 < 0x101)) {
          return 0xffffffffffffffff;
        }
        break;
      default:
        return 0xffffffffffffffff;
      }
      if (in_RDI != (undefined1 *)0x0) {
        *(ulong *)(in_RDI + 0x10) = local_30;
        *(ulong *)(in_RDI + 8) = local_38;
      }
      local_8 = local_30 + 0x18;
    }
  }
  return local_8;
}

Assistant:

size_t apduCmdDec(apdu_cmd_t* cmd, const octet apdu[], size_t count)
{
	size_t cdf_len_len;
	size_t cdf_len;
	size_t rdf_len;
	// pre
	ASSERT(memIsValid(apdu, count));
	ASSERT(memIsNullOrValid(cmd, sizeof(apdu_cmd_t)));
	// декодировать заголовок
	if (count < 4)
		return SIZE_MAX;
	if (cmd)
	{
		ASSERT(memIsDisjoint2(cmd, sizeof(apdu_cmd_t), apdu, count));
		memSetZero(cmd, sizeof(apdu_cmd_t));
		cmd->cla = apdu[0], cmd->ins = apdu[1];
		cmd->p1 = apdu[2], cmd->p2 = apdu[3];
	}
	apdu += 4, count -= 4;
	// декодировать cdf_len
	if (count == 0 || count == 1 || count == 3 && apdu[0] == 0)
		cdf_len_len = 0, cdf_len = 0;
	else
	{
		ASSERT(count > 1);
		// короткая форма?
		if (apdu[0])
			cdf_len_len = 1, cdf_len = apdu[0];
		// длинная форма?
		else
		{
			if (count < 3)
				return SIZE_MAX;
			cdf_len_len = 3;
			cdf_len = apdu[1], cdf_len *= 256, cdf_len += apdu[2];
		}
		apdu += cdf_len_len, count -= cdf_len_len;
	}
	// декодировать cdf
	if (cdf_len > count)
		return SIZE_MAX;
	if (cmd)
		memCopy(cmd->cdf, apdu, cdf_len);
	apdu += cdf_len, count -= cdf_len;
	// декодировать rdf_len
	switch (count)
	{
	case 0:
		rdf_len = 0;
		break;
	case 1:
		// короткая форма
		rdf_len = apdu[0];
		if (rdf_len == 0)
			rdf_len = 256;
		if (cdf_len_len == 3)
			return SIZE_MAX;
		break;
	case 2:
		// длинная форма, 2 октета
		rdf_len = apdu[0], rdf_len *= 256, rdf_len += apdu[1];
		if (rdf_len == 0)
			rdf_len = 65536;
		if (cdf_len_len <= 1 || cdf_len < 256 && rdf_len <= 256)
			return SIZE_MAX;
		break;
	case 3:
		// длинная форма, 3 октета
		rdf_len = apdu[1], rdf_len *= 256, rdf_len += apdu[2];
		if (rdf_len == 0)
			rdf_len = 65536;
		if (apdu[0] != 0 || cdf_len_len != 0 || rdf_len <= 256)
			return SIZE_MAX;
		break;
	default:
		return SIZE_MAX;
	}
	// сохранить длины
	if (cmd)
		cmd->cdf_len = cdf_len, cmd->rdf_len = rdf_len;
	// возвратить размер cmd
	return sizeof(apdu_cmd_t) + cdf_len;
}